

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

void __thiscall
flatbuffers::java::JavaGenerator::GenVectorAccessObject
          (JavaGenerator *this,StructDef *struct_def,string *code)

{
  string *psVar1;
  Value *pVVar2;
  reference ppFVar3;
  bool bVar4;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  char *local_278;
  char *nullable_annotation;
  FieldDef *key_field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_260;
  iterator kit;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  allocator<char> local_201;
  undefined1 local_200 [8];
  string index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> method_start;
  string type_name;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string method_indent;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *code_local;
  StructDef *struct_def_local;
  JavaGenerator *this_local;
  
  local_20 = code;
  code_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  std::__cxx11::string::operator+=((string *)code,"\n");
  std::__cxx11::string::operator+=((string *)local_20,"  ");
  psVar1 = code_local + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                     ((SymbolTable<flatbuffers::Value> *)((long)&psVar1->field_2 + 8),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (pVVar2 == (Value *)0x0) {
    std::__cxx11::string::operator+=((string *)local_20,"public ");
  }
  std::__cxx11::string::operator+=((string *)local_20,"static ");
  std::__cxx11::string::operator+=((string *)local_20,"final ");
  std::__cxx11::string::operator+=((string *)local_20,"class Vector extends ");
  std::__cxx11::string::operator+=((string *)local_20,"BaseVector {\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"    ",&local_79);
  std::allocator<char>::~allocator(&local_79);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "public Vector ");
  std::__cxx11::string::operator+=
            ((string *)local_20,(string *)(type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)local_20,"__assign(int _vector, int _element_size, ByteBuffer _bb) { ");
  std::__cxx11::string::operator+=
            ((string *)local_20,"__reset(_vector, _element_size, _bb); return this; }\n\n");
  IdlNamer::Type_abi_cxx11_
            ((string *)((long)&method_start.field_2 + 8),&this->namer_,(StructDef *)code_local);
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "public ");
  std::operator+(&local_100,&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&method_start.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &local_100," get");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::operator+(&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 "(int j) { return get");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::operator+(&local_180,"(new ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&method_start.field_2 + 8));
  std::operator+(&local_160,&local_180,"(), j); }\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&index.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,"(");
  std::operator+(&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&index.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&method_start.field_2 + 8));
  std::operator+(&local_1a0,&local_1c0," obj, int j) { ");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_20," return obj.__assign(");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"__element(j)",&local_201);
  std::allocator<char>::~allocator(&local_201);
  bVar4 = (code_local[8].field_2._M_local_buf[0] & 1U) == 0;
  if (bVar4) {
    std::operator+(&local_248,"__indirect(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    std::operator+(&local_228,&local_248,", bb)");
  }
  else {
    std::__cxx11::string::string((string *)&local_228,(string *)local_200);
  }
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::__cxx11::string::operator+=((string *)local_20,", bb); }\n");
  if ((code_local[8].field_2._M_local_buf[0] & 1U) == 0) {
    kit._M_current = (FieldDef **)(&code_local[7].field_2._M_allocated_capacity + 1);
    local_260._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                    kit._M_current);
    while( true ) {
      key_field = (FieldDef *)
                  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      kit._M_current);
      bVar4 = __gnu_cxx::operator!=
                        (&local_260,
                         (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&key_field);
      if (!bVar4) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_260);
      nullable_annotation = (char *)*ppFVar3;
      if ((((FieldDef *)nullable_annotation)->key & 1U) != 0) {
        local_278 = "";
        if (((((this->super_BaseGenerator).parser_)->opts).gen_nullable & 1U) != 0) {
          local_278 = "@Nullable ";
        }
        std::operator+(&local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,local_278);
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::operator+(&local_2d8,"public ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&method_start.field_2 + 8));
        std::operator+(&local_2b8,&local_2d8," ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::operator+=((string *)local_20,"getByKey(");
        GenTypeNameDest_abi_cxx11_(&local_318,this,(Type *)(nullable_annotation + 200));
        std::operator+(&local_2f8,&local_318," key) { ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::operator+=((string *)local_20," return __lookup_by_key(null, ");
        std::__cxx11::string::operator+=((string *)local_20,"__vector(), key, ");
        std::__cxx11::string::operator+=((string *)local_20,"bb); ");
        std::__cxx11::string::operator+=((string *)local_20,"}\n");
        std::operator+(&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,local_278);
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::operator+(&local_378,"public ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&method_start.field_2 + 8));
        std::operator+(&local_358,&local_378," ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::operator+=((string *)local_20,"getByKey(");
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&method_start.field_2 + 8)," obj, ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        GenTypeNameDest_abi_cxx11_(&local_3d8,this,(Type *)(nullable_annotation + 200));
        std::operator+(&local_3b8,&local_3d8," key) { ");
        std::__cxx11::string::operator+=((string *)local_20,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::operator+=((string *)local_20," return __lookup_by_key(obj, ");
        std::__cxx11::string::operator+=((string *)local_20,"__vector(), key, ");
        std::__cxx11::string::operator+=((string *)local_20,"bb); ");
        std::__cxx11::string::operator+=((string *)local_20,"}\n");
        break;
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_260);
    }
  }
  std::__cxx11::string::operator+=((string *)local_20,"  }\n");
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)(method_start.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void GenVectorAccessObject(StructDef &struct_def, std::string &code) const {
    // Generate a vector of structs accessor class.
    code += "\n";
    code += "  ";
    if (!struct_def.attributes.Lookup("private")) code += "public ";
    code += "static ";
    code += "final ";
    code += "class Vector extends ";
    code += "BaseVector {\n";

    // Generate the __assign method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    std::string method_indent = "    ";
    code += method_indent + "public Vector ";
    code += "__assign(int _vector, int _element_size, ByteBuffer _bb) { ";
    code += "__reset(_vector, _element_size, _bb); return this; }\n\n";

    auto type_name = namer_.Type(struct_def);
    auto method_start = method_indent + "public " + type_name + " get";
    // Generate the accessors that don't do object reuse.
    code += method_start + "(int j) { return get";
    code += "(new " + type_name + "(), j); }\n";
    code += method_start + "(" + type_name + " obj, int j) { ";
    code += " return obj.__assign(";
    std::string index = "__element(j)";
    code += struct_def.fixed ? index : "__indirect(" + index + ", bb)";
    code += ", bb); }\n";
    // See if we should generate a by-key accessor.
    if (!struct_def.fixed) {
      auto &fields = struct_def.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        auto &key_field = **kit;
        if (key_field.key) {
          auto nullable_annotation =
              parser_.opts.gen_nullable ? "@Nullable " : "";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(null, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += type_name + " obj, ";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(obj, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          break;
        }
      }
    }
    code += "  }\n";
  }